

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_csr.hpp
# Opt level: O0

void run<unsigned_int,double,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *A_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *A_cols,
               vector<double,_std::allocator<double>_> *A_values,
               vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               *B)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  mapped_type *pmVar5;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint nnz_index;
  uint row_stop;
  size_t row;
  uint row_start;
  size_t N;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *this;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *this_00;
  undefined4 local_40;
  size_type in_stack_ffffffffffffffc8;
  ulong uVar6;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::resize((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffc8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,0);
  local_40 = *pvVar3;
  for (uVar6 = 0; uVar6 < sVar2 - 1; uVar6 = uVar6 + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,uVar6 + 1);
    uVar1 = *pvVar3;
    for (; local_40 < uVar1; local_40 = local_40 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(ulong)local_40);
      this_00 = (flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *)*pvVar4;
      this = in_RCX;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI,(ulong)local_40);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::operator[](this,(ulong)*pvVar3);
      pmVar5 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
               operator[](this_00,(key_type *)this);
      *pmVar5 = (mapped_type)this_00;
    }
    local_40 = uVar1;
  }
  do_nothing(in_RCX);
  return;
}

Assistant:

void run(std::vector<IndexT> const & A_rows, std::vector<IndexT> const & A_cols, std::vector<NumericT> const & A_values,
         std::vector<RowT> & B)
{
  std::size_t N = A_rows.size() - 1;
  B.resize(N);

  IndexT row_start = A_rows[0];
  for (std::size_t row = 0; row < N; ++row)
  {
    IndexT row_stop  = A_rows[row+1];

    for (IndexT nnz_index = row_start; nnz_index < row_stop; ++nnz_index)
      B[A_cols[nnz_index]][row] = A_values[nnz_index];

    row_start = row_stop;
  }

  do_nothing(B);
}